

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyDebugNamesCULists(DWARFVerifier *this,DWARFDebugNames *AccelTable)

{
  uint NumEntries;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar1;
  value_type *pvVar2;
  pointer pvVar3;
  raw_ostream *prVar4;
  uint32_t CU_1;
  uint32_t CU_00;
  value_type *KV;
  unsigned_long *Vals_2;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *CU;
  NameIndex *this_00;
  unit_iterator_range uVar5;
  iterator iVar6;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
  local_f0;
  NameIndex *local_80;
  undefined1 local_78 [8];
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  CUMap;
  uint64_t local_58;
  pointer local_50;
  uint64_t Offset;
  DWARFVerifier *local_40;
  uint local_34;
  
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::init((DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
          *)local_78,(EVP_PKEY_CTX *)0x0);
  local_40 = this;
  NumEntries = DWARFContext::getNumCompileUnits(this->DCtx);
  DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::reserve((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
             *)local_78,NumEntries);
  uVar5 = DWARFContext::info_section_units(local_40->DCtx);
  for (puVar1 = uVar5.begin_iterator; puVar1 != uVar5.end_iterator; puVar1 = puVar1 + 1) {
    local_f0.super_formatv_object_base.Fmt.Data =
         (char *)(((puVar1->_M_t).
                   super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
                   super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl)->Header).Offset;
    pvVar2 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
             ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                                 *)local_78,(unsigned_long *)&local_f0);
    (pvVar2->super_pair<unsigned_long,_unsigned_long>).second = 0xffffffffffffffff;
  }
  this_00 = (NameIndex *)
            (AccelTable->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
            super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
            super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
            super_SmallVectorBase.BeginX;
  local_80 = this_00 + (AccelTable->NameIndices).
                       super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                       super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                       super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                       super_SmallVectorBase.Size;
  local_34 = 0;
  for (; this_00 != local_80; this_00 = this_00 + 1) {
    CUMap._20_4_ = (this_00->Hdr).super_HeaderPOD.CompUnitCount;
    if (CUMap._20_4_ == 0) {
      prVar4 = error(local_40);
      local_50 = (pointer)this_00->Base;
      formatv<unsigned_long>
                ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>
                  *)&local_f0,"Name Index @ {0:x} does not index any CU\n",
                 (unsigned_long *)&stack0xffffffffffffffb0);
      raw_ostream::operator<<(prVar4,&local_f0.super_formatv_object_base);
      formatv_object_base::~formatv_object_base(&local_f0.super_formatv_object_base);
      local_34 = local_34 + 1;
    }
    else {
      for (CU_00 = 0; CUMap._20_4_ != CU_00; CU_00 = CU_00 + 1) {
        pvVar3 = (pointer)DWARFDebugNames::NameIndex::getCUOffset(this_00,CU_00);
        local_50 = pvVar3;
        iVar6 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                ::find((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                        *)local_78,(const_arg_type_t<unsigned_long>)&stack0xffffffffffffffb0);
        pvVar3 = iVar6.Ptr;
        if (pvVar3 == (pointer)((long)local_78 + (ulong)CUMap.NumEntries * 0x10)) {
          prVar4 = error(local_40);
          local_58 = this_00->Base;
          formatv<unsigned_long,_unsigned_long_&>
                    ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                      *)&local_f0,"Name Index @ {0:x} references a non-existing CU @ {1:x}\n",
                     &local_58,(unsigned_long *)&stack0xffffffffffffffb0);
          raw_ostream::operator<<(prVar4,&local_f0.super_formatv_object_base);
          formatv_object_base::~formatv_object_base(&local_f0.super_formatv_object_base);
          local_34 = local_34 + 1;
        }
        else {
          Vals_2 = &(pvVar3->super_pair<unsigned_long,_unsigned_long>).second;
          if ((pvVar3->super_pair<unsigned_long,_unsigned_long>).second == 0xffffffffffffffff) {
            *Vals_2 = this_00->Base;
          }
          else {
            prVar4 = error(local_40);
            local_58 = this_00->Base;
            formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&>
                      (&local_f0,
                       "Name Index @ {0:x} references a CU @ {1:x}, but this CU is already indexed by Name Index @ {2:x}\n"
                       ,&local_58,(unsigned_long *)&stack0xffffffffffffffb0,Vals_2);
            raw_ostream::operator<<(prVar4,&local_f0.super_formatv_object_base);
            formatv_object_base::~formatv_object_base(&local_f0.super_formatv_object_base);
          }
        }
      }
    }
  }
  _local_50 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
              ::begin((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                       *)local_78);
  pvVar3 = local_50;
  while (pvVar3 != (pointer)((long)local_78 + (ulong)CUMap.NumEntries * 0x10)) {
    if ((pvVar3->super_pair<unsigned_long,_unsigned_long>).second == 0xffffffffffffffff) {
      prVar4 = warn(local_40);
      formatv<const_unsigned_long_&>
                ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
                  *)&local_f0,"CU @ {0:x} not covered by any Name Index\n",(unsigned_long *)pvVar3);
      raw_ostream::operator<<(prVar4,&local_f0.super_formatv_object_base);
      formatv_object_base::~formatv_object_base(&local_f0.super_formatv_object_base);
    }
    DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
    ::operator++((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                  *)&stack0xffffffffffffffb0);
    pvVar3 = local_50;
  }
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::~DenseMap((DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
               *)local_78);
  return local_34;
}

Assistant:

unsigned
DWARFVerifier::verifyDebugNamesCULists(const DWARFDebugNames &AccelTable) {
  // A map from CU offset to the (first) Name Index offset which claims to index
  // this CU.
  DenseMap<uint64_t, uint64_t> CUMap;
  const uint64_t NotIndexed = std::numeric_limits<uint64_t>::max();

  CUMap.reserve(DCtx.getNumCompileUnits());
  for (const auto &CU : DCtx.compile_units())
    CUMap[CU->getOffset()] = NotIndexed;

  unsigned NumErrors = 0;
  for (const DWARFDebugNames::NameIndex &NI : AccelTable) {
    if (NI.getCUCount() == 0) {
      error() << formatv("Name Index @ {0:x} does not index any CU\n",
                         NI.getUnitOffset());
      ++NumErrors;
      continue;
    }
    for (uint32_t CU = 0, End = NI.getCUCount(); CU < End; ++CU) {
      uint64_t Offset = NI.getCUOffset(CU);
      auto Iter = CUMap.find(Offset);

      if (Iter == CUMap.end()) {
        error() << formatv(
            "Name Index @ {0:x} references a non-existing CU @ {1:x}\n",
            NI.getUnitOffset(), Offset);
        ++NumErrors;
        continue;
      }

      if (Iter->second != NotIndexed) {
        error() << formatv("Name Index @ {0:x} references a CU @ {1:x}, but "
                           "this CU is already indexed by Name Index @ {2:x}\n",
                           NI.getUnitOffset(), Offset, Iter->second);
        continue;
      }
      Iter->second = NI.getUnitOffset();
    }
  }

  for (const auto &KV : CUMap) {
    if (KV.second == NotIndexed)
      warn() << formatv("CU @ {0:x} not covered by any Name Index\n", KV.first);
  }

  return NumErrors;
}